

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_context.cpp
# Opt level: O3

ClientProperties * __thiscall
duckdb::ClientContext::GetClientProperties
          (ClientProperties *__return_storage_ptr__,ClientContext *this)

{
  shared_ptr<duckdb::DatabaseInstance,_true> *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ArrowOffsetSize AVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  SettingLookupResult SVar6;
  DatabaseInstance *pDVar7;
  string timezone;
  Value result;
  char *local_e8;
  size_type local_e0;
  char local_d8;
  undefined7 uStack_d7;
  undefined8 uStack_d0;
  undefined1 *local_c8;
  long local_c0;
  undefined1 local_b8 [16];
  string local_a8;
  LogicalType local_88;
  Value local_70;
  
  local_c8 = local_b8;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"UTC","");
  LogicalType::LogicalType(&local_88,SQLNULL);
  Value::Value(&local_70,&local_88);
  LogicalType::~LogicalType(&local_88);
  paVar1 = &local_a8.field_2;
  local_a8._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"TimeZone","");
  SVar6 = TryGetCurrentSetting(this,&local_a8,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  if (SVar6.scope != INVALID) {
    Value::ToString_abi_cxx11_(&local_a8,&local_70);
    ::std::__cxx11::string::operator=((string *)&local_c8,(string *)&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
  }
  local_e8 = &local_d8;
  ::std::__cxx11::string::_M_construct<char*>((string *)&local_e8,local_c8,local_c8 + local_c0);
  this_00 = &this->db;
  pDVar7 = shared_ptr<duckdb::DatabaseInstance,_true>::operator->(this_00);
  AVar2 = (pDVar7->config).options.arrow_offset_size;
  pDVar7 = shared_ptr<duckdb::DatabaseInstance,_true>::operator->(this_00);
  bVar3 = (pDVar7->config).options.arrow_use_list_view;
  pDVar7 = shared_ptr<duckdb::DatabaseInstance,_true>::operator->(this_00);
  bVar4 = (pDVar7->config).options.produce_arrow_string_views;
  pDVar7 = shared_ptr<duckdb::DatabaseInstance,_true>::operator->(this_00);
  bVar5 = (pDVar7->config).options.arrow_lossless_conversion;
  paVar1 = &(__return_storage_ptr__->time_zone).field_2;
  (__return_storage_ptr__->time_zone)._M_dataplus._M_p = (pointer)paVar1;
  if (local_e8 == &local_d8) {
    paVar1->_M_allocated_capacity = CONCAT71(uStack_d7,local_d8);
    *(undefined8 *)((long)&(__return_storage_ptr__->time_zone).field_2 + 8) = uStack_d0;
  }
  else {
    (__return_storage_ptr__->time_zone)._M_dataplus._M_p = local_e8;
    (__return_storage_ptr__->time_zone).field_2._M_allocated_capacity = CONCAT71(uStack_d7,local_d8)
    ;
  }
  (__return_storage_ptr__->time_zone)._M_string_length = local_e0;
  local_e0 = 0;
  local_d8 = '\0';
  __return_storage_ptr__->arrow_offset_size = AVar2;
  __return_storage_ptr__->arrow_use_list_view = bVar3;
  __return_storage_ptr__->produce_arrow_string_view = bVar4;
  __return_storage_ptr__->arrow_lossless_conversion = bVar5;
  (__return_storage_ptr__->client_context).ptr = this;
  local_e8 = &local_d8;
  Value::~Value(&local_70);
  if (local_c8 != local_b8) {
    operator_delete(local_c8);
  }
  return __return_storage_ptr__;
}

Assistant:

ClientProperties ClientContext::GetClientProperties() {
	string timezone = "UTC";
	Value result;

	if (TryGetCurrentSetting("TimeZone", result)) {
		timezone = result.ToString();
	}
	return {timezone,
	        db->config.options.arrow_offset_size,
	        db->config.options.arrow_use_list_view,
	        db->config.options.produce_arrow_string_views,
	        db->config.options.arrow_lossless_conversion,
	        this};
}